

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O3

int ebur128_init_filter(ebur128_state *st)

{
  uint uVar1;
  ebur128_state_internal *peVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t __size;
  undefined1 auVar5 [16];
  filter_state *__s;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  dVar9 = tan(5284.078578647628 /
              (((double)CONCAT44(0x45300000,(int)(st->samplerate >> 0x20)) - 1.9342813113834067e+25)
              + ((double)CONCAT44(0x43300000,(int)st->samplerate) - 4503599627370496.0)));
  dVar18 = (dVar9 * 1.2587209302325617) / 0.7071752369554196;
  dVar12 = dVar9 * dVar9;
  dVar11 = tan(119.8061151453059 /
               (((double)CONCAT44(0x45300000,(int)(st->samplerate >> 0x20)) - 1.9342813113834067e+25
                ) + ((double)CONCAT44(0x43300000,(int)st->samplerate) - 4503599627370496.0)));
  dVar19 = dVar11 * dVar11 + -1.0;
  peVar2 = st->d;
  peVar2->a[0] = 1.0;
  auVar13._8_8_ = dVar9;
  auVar13._0_8_ = dVar11;
  auVar14 = divpd(auVar13,_DAT_00109c80);
  dVar20 = dVar11 * dVar11 + auVar14._0_8_ + 1.0;
  dVar9 = dVar9 * dVar9 + auVar14._8_8_ + 1.0;
  uVar7 = SUB84(dVar9,0);
  uVar8 = (undefined4)((ulong)dVar9 >> 0x20);
  auVar15._8_8_ = (1.0 - auVar14._8_8_) + dVar12;
  auVar15._0_8_ = dVar19 + dVar19;
  auVar16._8_4_ = uVar7;
  auVar16._0_8_ = dVar20;
  auVar16._12_4_ = uVar8;
  auVar16 = divpd(auVar15,auVar16);
  dVar19 = auVar16._0_8_;
  dVar17 = auVar16._8_8_;
  auVar10._0_8_ = (1.0 - auVar14._0_8_) + dVar11 * dVar11;
  auVar10._8_8_ = dVar12 + -1.0 + dVar12 + -1.0;
  auVar14._8_4_ = uVar7;
  auVar14._0_8_ = dVar20;
  auVar14._12_4_ = uVar8;
  auVar16 = divpd(auVar10,auVar14);
  dVar21 = (dVar18 + 1.5848647011308556 + dVar12) / dVar9;
  peVar2->b[0] = dVar21;
  auVar5._8_8_ = dVar12 + -1.5848647011308556 + dVar12 + -1.5848647011308556;
  auVar5._0_8_ = (1.5848647011308556 - dVar18) + dVar12;
  auVar3._8_4_ = uVar7;
  auVar3._0_8_ = dVar9;
  auVar3._12_4_ = uVar8;
  auVar14 = divpd(auVar5,auVar3);
  dVar20 = auVar14._8_8_;
  peVar2->b[1] = dVar20 - (dVar21 + dVar21);
  dVar11 = auVar14._0_8_;
  dVar9 = dVar20 - (dVar11 + dVar11);
  auVar4._8_4_ = SUB84(dVar9,0);
  auVar4._0_8_ = dVar11 + (dVar21 - (dVar20 + dVar20));
  auVar4._12_4_ = (int)((ulong)dVar9 >> 0x20);
  *(undefined1 (*) [16])(peVar2->b + 2) = auVar4;
  peVar2->b[4] = dVar11;
  dVar11 = auVar16._8_8_;
  dVar9 = auVar16._0_8_;
  peVar2->a[1] = dVar11 + dVar19;
  peVar2->a[2] = dVar11 * dVar19 + dVar9 + dVar17;
  peVar2->a[3] = dVar11 * dVar9 + dVar19 * dVar17;
  peVar2->a[4] = dVar17 * dVar9;
  uVar1 = st->channels;
  __size = (ulong)uVar1 * 0x28;
  __s = (filter_state *)malloc(__size);
  peVar2->v = __s;
  if (__s == (filter_state *)0x0) {
    iVar6 = 1;
  }
  else {
    iVar6 = 0;
    if (0 < (int)uVar1) {
      memset(__s,0,__size);
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int ebur128_init_filter(ebur128_state* st) {
  int errcode = EBUR128_SUCCESS;
  int i, j;

  double f0 = 1681.974450955533;
  double G = 3.999843853973347;
  double Q = 0.7071752369554196;

  double K = tan(M_PI * f0 / (double) st->samplerate);
  double Vh = pow(10.0, G / 20.0);
  double Vb = pow(Vh, 0.4996667741545416);

  double pb[3] = { 0.0, 0.0, 0.0 };
  double pa[3] = { 1.0, 0.0, 0.0 };
  double rb[3] = { 1.0, -2.0, 1.0 };
  double ra[3] = { 1.0, 0.0, 0.0 };

  double a0 = 1.0 + K / Q + K * K;
  pb[0] = (Vh + Vb * K / Q + K * K) / a0;
  pb[1] = 2.0 * (K * K - Vh) / a0;
  pb[2] = (Vh - Vb * K / Q + K * K) / a0;
  pa[1] = 2.0 * (K * K - 1.0) / a0;
  pa[2] = (1.0 - K / Q + K * K) / a0;

  /* fprintf(stderr, "%.14f %.14f %.14f %.14f %.14f\n",
                     b1[0], b1[1], b1[2], a1[1], a1[2]); */

  f0 = 38.13547087602444;
  Q = 0.5003270373238773;
  K = tan(M_PI * f0 / (double) st->samplerate);

  ra[1] = 2.0 * (K * K - 1.0) / (1.0 + K / Q + K * K);
  ra[2] = (1.0 - K / Q + K * K) / (1.0 + K / Q + K * K);

  /* fprintf(stderr, "%.14f %.14f\n", a2[1], a2[2]); */

  st->d->b[0] = pb[0] * rb[0];
  st->d->b[1] = pb[0] * rb[1] + pb[1] * rb[0];
  st->d->b[2] = pb[0] * rb[2] + pb[1] * rb[1] + pb[2] * rb[0];
  st->d->b[3] = pb[1] * rb[2] + pb[2] * rb[1];
  st->d->b[4] = pb[2] * rb[2];

  st->d->a[0] = pa[0] * ra[0];
  st->d->a[1] = pa[0] * ra[1] + pa[1] * ra[0];
  st->d->a[2] = pa[0] * ra[2] + pa[1] * ra[1] + pa[2] * ra[0];
  st->d->a[3] = pa[1] * ra[2] + pa[2] * ra[1];
  st->d->a[4] = pa[2] * ra[2];

  st->d->v = (filter_state*) malloc(st->channels * sizeof(filter_state));
  CHECK_ERROR(!st->d->v, EBUR128_ERROR_NOMEM, exit);
  for (i = 0; i < (int) st->channels; ++i) {
    for (j = 0; j < FILTER_STATE_SIZE; ++j) {
      st->d->v[i][j] = 0.0;
    }
  }

exit:
  return errcode;
}